

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_successWithOutputParameterOfType_Test::testBody
          (TEST_MockSupport_c_successWithOutputParameterOfType_Test *this)

{
  MockSupport_c *pMVar1;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  undefined1 local_40 [8];
  TestTestingFixture fixture;
  TEST_MockSupport_c_successWithOutputParameterOfType_Test *this_local;
  
  fixture.result_ = (TestResult *)this;
  TestTestingFixture::TestTestingFixture((TestTestingFixture *)local_40);
  pMVar1 = mock_c();
  (*pMVar1->installCopier)("intType",typeCopy);
  TestTestingFixture::setTestFunction
            ((TestTestingFixture *)local_40,callToMockCWithOutputParameterOfType_);
  TestTestingFixture::runAllTests((TestTestingFixture *)local_40);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = TestTestingFixture::getCheckCount((TestTestingFixture *)local_40);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,2,sVar3,"LONGS_EQUAL(2, fixture.getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x2f2,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = TestTestingFixture::getFailureCount((TestTestingFixture *)local_40);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,sVar3,"LONGS_EQUAL(0, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x2f3,pTVar4);
  pMVar1 = mock_c();
  (*pMVar1->removeAllComparatorsAndCopiers)();
  TestTestingFixture::~TestTestingFixture((TestTestingFixture *)local_40);
  return;
}

Assistant:

TEST(MockSupport_c, successWithOutputParameterOfType)
{
    TestTestingFixture fixture;
    mock_c()->installCopier("intType", typeCopy);
    fixture.setTestFunction(callToMockCWithOutputParameterOfType_);
    fixture.runAllTests();
    LONGS_EQUAL(2, fixture.getCheckCount());
    LONGS_EQUAL(0, fixture.getFailureCount());
    mock_c()->removeAllComparatorsAndCopiers();
}